

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O2

void char_update(void)

{
  long *plVar1;
  byte *pbVar2;
  undefined2 uVar3;
  uint uVar4;
  CHAR_DATA *pCVar5;
  ROOM_INDEX_DATA *pRVar6;
  PC_DATA *pPVar7;
  AFFECT_DATA *pAVar8;
  char_data *this;
  byte bVar9;
  float fVar10;
  bool bVar11;
  short sVar12;
  int iVar13;
  int iVar14;
  OBJ_DATA *obj;
  CClass *pCVar15;
  ushort uVar16;
  CHAR_DATA *pCVar17;
  AFFECT_DATA *paf;
  char *pcVar18;
  CProficiencies *this_00;
  CHAR_DATA *pCVar19;
  bool bVar20;
  string_view fmt;
  char buf1 [4608];
  
  bVar20 = 1 < save_number;
  save_number = save_number + 1;
  if (bVar20) {
    save_number = 0;
  }
  bVar20 = false;
  pCVar5 = char_list;
LAB_00319b2b:
  do {
    pCVar19 = pCVar5;
    pCVar5 = char_list;
    if (pCVar19 == (CHAR_DATA *)0x0) {
      while (pCVar19 = pCVar5, pCVar19 != (CHAR_DATA *)0x0) {
        pCVar5 = pCVar19->next;
        if ((pCVar19->desc != (DESCRIPTOR_DATA *)0x0) &&
           (save_number == pCVar19->desc->descriptor % 3)) {
          save_char_obj(pCVar19);
        }
      }
      return;
    }
    pCVar5 = pCVar19->next;
    bVar11 = is_npc(pCVar19);
    if ((((!bVar11) || (1 < (ushort)(sun - 1U))) || (pCVar19->in_room == (ROOM_INDEX_DATA *)0x0)) ||
       (((iVar13 = number_percent(), 0x59 < iVar13 ||
         (bVar11 = is_affected_by(pCVar19,0x11), bVar11)) || (pCVar19->fighting != (CHAR_DATA *)0x0)
        ))) {
      bVar11 = is_npc(pCVar19);
      if (((bVar11) && (2 < sun)) &&
         ((pCVar19->in_room != (ROOM_INDEX_DATA *)0x0 &&
          ((iVar13 = number_percent(), iVar13 < 0x5a && (pCVar19->fighting == (CHAR_DATA *)0x0))))))
      {
        if (((pCVar19->act[0] & 0x80000000) == 0) ||
           (bVar11 = is_affected_by(pCVar19,0x1e), !bVar11)) {
          bVar9 = (byte)pCVar19->act[1] & 1;
          goto joined_r0x0031a000;
        }
        goto LAB_0031a50d;
      }
    }
    else if (((pCVar19->act[1] & 1) == 0) || (bVar11 = is_affected_by(pCVar19,0x1e), !bVar11)) {
      bVar9 = *(byte *)((long)pCVar19->act + 3) & 0x80;
joined_r0x0031a000:
      if ((bVar9 != 0) && (bVar11 = is_affected_by(pCVar19,0x1e), !bVar11)) {
        pbVar2 = (byte *)((long)pCVar19->affected_by + 3);
        *pbVar2 = *pbVar2 | 0x40;
      }
    }
    else {
LAB_0031a50d:
      pbVar2 = (byte *)((long)pCVar19->affected_by + 3);
      *pbVar2 = *pbVar2 & 0xbf;
    }
    if (0 < pCVar19->pause) {
      pCVar19->pause = pCVar19->pause + -1;
    }
    bVar11 = is_npc(pCVar19);
    if (((bVar11) && (pCVar19->hit < 0)) && (pCVar19->in_room != (ROOM_INDEX_DATA *)0x0)) {
      fmt._M_str = "{} in {} has HP {}";
      fmt._M_len = 0x12;
      CLogger::Warn<char*&,short&,int&>
                ((CLogger *)&RS.field_0x140,fmt,&pCVar19->name,&pCVar19->in_room->vnum,&pCVar19->hit
                );
    }
    sVar12 = pCVar19->ghost;
    if (0 < sVar12) {
      pCVar19->ghost = sVar12 + -1;
      if (sVar12 == 1) {
        pcVar18 = "You are no longer a ghost.\n\r";
      }
      else {
        pcVar18 = "Your body starts to collect itself.\n\r";
        if (sVar12 != 5) {
          if (sVar12 != 3) goto LAB_00319c67;
          pcVar18 = "Your body begins to solidify.\n\r";
        }
      }
      send_to_char(pcVar18,pCVar19);
    }
LAB_00319c67:
    if (0 < pCVar19->bounty_timer) {
      pCVar19->bounty_timer = pCVar19->bounty_timer + -1;
    }
    if (0 < pCVar19->ghost) {
      bVar20 = true;
    }
    bVar11 = is_npc(pCVar19);
    if (((!bVar11) && (sVar12 = pCVar19->level, sVar12 < 0x14)) &&
       ((ushort)(pCVar19->in_room->vnum + 0x9fe8U) < 0xff9c)) {
      while (sVar12 < 0x14) {
        pCVar19->level = sVar12 + 1;
        advance_level(pCVar19,true);
        sVar12 = pCVar19->level;
      }
      iVar13 = exp_per_level(pCVar19);
      pCVar19->exp = (pCVar19->level + -1) * iVar13;
      colorconv(buf1,"{RYou feel more experienced as you depart the Adventurer\'s Academy!{x\n\r",
                pCVar19);
      send_to_char(buf1,pCVar19);
      colorconv(buf1,"{GYou are now level 20.{x\n\r",pCVar19);
      send_to_char(buf1,pCVar19);
      if (pCVar19->pet != (CHAR_DATA *)0x0) {
        sprintf(buf1,
                "Remember, you can ask your familiar questions.  For example, \'say %s, how do I get to my guild?\'.\n\r"
                ,pCVar19->pet->short_descr);
        send_to_char(buf1,pCVar19);
      }
    }
    bVar11 = is_npc(pCVar19);
    if (!bVar11) {
      if (pCVar19->pcdata == (PC_DATA *)0x0) {
        this_00 = &prof_none;
      }
      else {
        this_00 = &pCVar19->pcdata->profs;
      }
      CProficiencies::UpdateProfPoints(this_00);
    }
    bVar11 = is_affected_by(pCVar19,0x11);
    if (((!bVar11) && (bVar11 = is_affected(pCVar19,(int)gsn_bleeding), bVar11)) &&
       (pCVar19->position == 4)) {
      pCVar19->position = 8;
    }
    if (pCVar19->position < 3) {
LAB_00319e9f:
      damage_new(pCVar19,pCVar19,2,(int)gsn_bleeding,0x13,true,false,0,1,"slow bleeding");
    }
    else {
      iVar13 = (int)pCVar19->max_hit;
      if (pCVar19->hit < iVar13) {
        iVar13 = hit_gain(pCVar19);
        iVar13 = iVar13 + pCVar19->hit;
      }
      pCVar19->hit = iVar13;
      sVar12 = pCVar19->max_mana;
      if (pCVar19->mana < sVar12) {
        iVar13 = mana_gain(pCVar19);
        sVar12 = (short)iVar13 + pCVar19->mana;
      }
      pCVar19->mana = sVar12;
      sVar12 = pCVar19->max_move;
      if (pCVar19->move < sVar12) {
        bVar11 = is_affected(pCVar19,(int)gsn_repose);
        iVar13 = move_gain(pCVar19);
        sVar12 = (short)(iVar13 << bVar11) + pCVar19->move;
      }
      pCVar19->move = sVar12;
      sVar12 = pCVar19->position;
      if (sVar12 == 3) {
        update_pos(pCVar19);
        sVar12 = pCVar19->position;
      }
      if (sVar12 < 3) goto LAB_00319e9f;
    }
    fVar10 = pCVar19->talismanic + -0.0625;
    if (fVar10 <= 0.0) {
      fVar10 = 0.0;
    }
    pCVar19->talismanic = fVar10;
    bVar11 = is_npc(pCVar19);
    if ((!bVar11) && (pRVar6 = pCVar19->in_room, pRVar6 != (ROOM_INDEX_DATA *)0x0)) {
      pPVar7 = pCVar19->pcdata;
      plVar1 = pPVar7->sect_time;
      *plVar1 = *plVar1 + 1;
      plVar1 = pPVar7->sect_time + pRVar6->sector_type;
      *plVar1 = *plVar1 + 1;
    }
    bVar11 = is_npc(pCVar19);
    if (!bVar11) {
      sVar12 = pCVar19->pcdata->save_timer;
      if (sVar12 != 0) {
        pCVar19->pcdata->save_timer = sVar12 + -1;
      }
    }
    bVar11 = is_npc(pCVar19);
    if (bVar11) {
LAB_0031a0e3:
      bVar11 = is_npc(pCVar19);
      if ((bVar11) || (pCVar19->desc != (DESCRIPTOR_DATA *)0x0)) {
        pAVar8 = pCVar19->affected;
LAB_0031a10d:
        while( true ) {
          paf = pAVar8;
          if (paf == (AFFECT_DATA *)0x0) goto joined_r0x0031a45c;
          pAVar8 = paf->next;
          if ((!bVar20) && (0 < pCVar19->ghost)) goto LAB_00319b2b;
          if (paf->duration < 1) break;
          if (paf->tick_fun != (AFF_FUN *)0x0) {
            (*paf->tick_fun)(pCVar19,paf);
          }
          if ((!bVar20) && (0 < pCVar19->ghost)) goto LAB_00319b2b;
          paf->duration = paf->duration + -1;
          iVar13 = number_range(0,4);
          if ((iVar13 == 0) && (0 < paf->level)) {
            paf->level = paf->level + -1;
          }
        }
        if (-1 < paf->duration) {
          this = paf->owner;
          if (paf->type == gsn_entwine) {
            if ((this != (char_data *)0x0) && (pCVar19->in_room == this->in_room)) {
LAB_0031a1f3:
              pCVar15 = char_data::Class(this);
              iVar13 = CClass::GetIndex(pCVar15);
              if (iVar13 == 4) goto LAB_0031a244;
              if (paf->owner == (CHAR_DATA *)0x0) goto LAB_0031a210;
              goto LAB_0031a300;
            }
          }
          else {
            if (this != (char_data *)0x0) goto LAB_0031a1f3;
LAB_0031a210:
            pCVar15 = char_data::Class(pCVar19);
            iVar13 = CClass::GetIndex(pCVar15);
            if (iVar13 == 4) {
              pCVar17 = paf->owner;
              if (paf->owner == (CHAR_DATA *)0x0) {
                pCVar17 = pCVar19;
              }
              bVar11 = trusts(pCVar19,pCVar17);
              if (bVar11) {
LAB_0031a244:
                if (paf->aftype == 4) {
                  iVar13 = number_percent();
                  pCVar17 = paf->owner;
                  if (paf->owner == (CHAR_DATA *)0x0) {
                    pCVar17 = pCVar19;
                  }
                  iVar14 = get_skill(pCVar17,(int)gsn_channeling);
                  if (((double)iVar13 < (double)iVar14 * 0.85) &&
                     ((skill_table[paf->type].dispel & 4) == 0)) {
                    pCVar17 = paf->owner;
                    if (paf->owner == (CHAR_DATA *)0x0) {
                      pCVar17 = pCVar19;
                    }
                    check_improve(pCVar17,(int)gsn_channeling,true,1);
                    pCVar17 = paf->owner;
                    if (pCVar17 == (CHAR_DATA *)0x0 || pCVar19 == pCVar17) {
                      pcVar18 = 
                      "You feel invigorated as your $t supplication is renewed by your deity.";
                      pCVar17 = (CHAR_DATA *)0x0;
                    }
                    else {
                      pcVar18 = "You feel invigorated as $N renews your $t supplication.";
                    }
                    act(pcVar18,pCVar19,skill_table[paf->type].name,pCVar17,3);
                    paf->duration = paf->init_duration;
                    iVar13 = (int)pCVar19->mana - (int)skill_table[paf->type].min_mana;
                    sVar12 = (short)iVar13;
                    if (iVar13 < 1) {
                      sVar12 = 0;
                    }
                    pCVar19->mana = sVar12;
                    goto LAB_0031a10d;
                  }
                }
              }
            }
LAB_0031a300:
            uVar16 = paf->type;
            if (((pAVar8 == (AFFECT_DATA *)0x0) || (pAVar8->type != uVar16)) ||
               (0 < pAVar8->duration)) {
              if (0 < (short)uVar16) {
                bVar11 = str_cmp(skill_table[uVar16].msg_off,"");
                uVar16 = paf->type;
                if (bVar11) {
                  send_to_char(skill_table[(short)uVar16].msg_off,pCVar19);
                  send_to_char("\n\r",pCVar19);
                  uVar16 = paf->type;
                }
              }
              if (((uVar16 != 0) &&
                  (bVar11 = str_cmp(skill_table[(short)uVar16].room_msg_off,""), bVar11)) &&
                 (bVar11 = is_awake(pCVar19), bVar11)) {
                act(skill_table[paf->type].room_msg_off,pCVar19,(void *)0x0,(void *)0x0,0);
              }
            }
          }
          affect_remove(pCVar19,paf);
          goto LAB_0031a10d;
        }
        if (paf->tick_fun != (AFF_FUN *)0x0) {
          (*paf->tick_fun)(pCVar19,paf);
        }
        if ((bVar20) || (pCVar19->ghost < 1)) goto LAB_0031a10d;
      }
      else {
joined_r0x0031a45c:
        if ((((bVar20) || (pCVar19->ghost < 1)) && (bVar11 = is_npc(pCVar19), !bVar11)) &&
           ((pCVar19->in_room != (ROOM_INDEX_DATA *)0x0 && (pCVar19->in_room->sector_type == 0xd))))
        {
          iVar13 = dice((int)(pCVar19->level / 2),2);
          damage_new(pCVar19,pCVar19,iVar13,(int)gsn_bleeding,4,true,false,0,1,"the searing heat*");
        }
      }
      goto LAB_00319b2b;
    }
    obj = get_eq_char(pCVar19,0);
    if (((obj != (OBJ_DATA *)0x0) && (obj->item_type == 1)) &&
       (uVar4 = obj->value[2], 0 < (int)uVar4)) {
      obj->value[2] = uVar4 - 1;
      if (uVar4 - 1 == 0) {
        pRVar6 = pCVar19->in_room;
        if (pRVar6 != (ROOM_INDEX_DATA *)0x0) {
          sVar12 = pRVar6->light;
          if (pRVar6->light < 4) {
            sVar12 = 3;
          }
          pRVar6->light = sVar12 + -3;
          act("$p goes out.",pCVar19,obj,(void *)0x0,0);
          act("$p flickers and goes out.",pCVar19,obj,(void *)0x0,3);
          extract_obj(obj);
        }
      }
      else if ((uVar4 < 7) && (pCVar19->in_room != (ROOM_INDEX_DATA *)0x0)) {
        act("$p flickers.",pCVar19,obj,(void *)0x0,3);
      }
    }
    uVar3 = pCVar19->timer;
    pCVar19->timer = uVar3 + 1;
    if ((((short)(uVar3 + 1) < 0x19) || (bVar11 = is_heroimm(pCVar19), bVar11)) ||
       ((bVar11 = is_immortal(pCVar19), bVar11 ||
        ((((pCVar19->act[0] & 0x8000) != 0 || (pCVar19->was_in_room != (ROOM_INDEX_DATA *)0x0)) ||
         (pCVar19->in_room == (ROOM_INDEX_DATA *)0x0)))))) {
      gain_condition(pCVar19,0,-1);
      gain_condition(pCVar19,2,1);
      gain_condition(pCVar19,3,1);
      goto LAB_0031a0e3;
    }
    pCVar19->was_in_room = pCVar19->in_room;
    if (pCVar19->fighting != (CHAR_DATA *)0x0) {
      stop_fighting(pCVar19,true);
    }
    act("$n disappears into the void.",pCVar19,(void *)0x0,(void *)0x0,0);
    send_to_char("You disappear into the void.\n\r",pCVar19);
    if (1 < pCVar19->level) {
      save_char_obj(pCVar19);
    }
    pCVar19->pause = 0;
    do_quit_new(pCVar19,"",true);
  } while( true );
}

Assistant:

void char_update(void)
{
	CHAR_DATA *ch;
	CHAR_DATA *ch_next;
	CHAR_DATA *ch_quit;
	int hgain;
	bool ghost= false;

	ch_quit = nullptr;

	/* update save counter */
	save_number++;

	if (save_number > 2)
		save_number = 0;

	for (ch = char_list; ch != nullptr; ch = ch_next)
	{
		CHAR_DATA *master;
		AFFECT_DATA *paf;
		AFFECT_DATA *paf_next;
		bool charm_gone;

		ch_next = ch->next;
		master = nullptr;

		if (is_npc(ch)
			&& (sun == SolarPosition::Sunrise || sun == SolarPosition::Daylight)
			&& ch->in_room
			&& number_percent() < 90
			&& !is_affected_by(ch, AFF_SLEEP)
			&& ch->fighting == nullptr)
		{
			if (IS_SET(ch->act, ACT_DIURNAL) && is_affected_by(ch, AFF_NOSHOW))
				REMOVE_BIT(ch->affected_by, AFF_NOSHOW);
			else if (IS_SET(ch->act, ACT_NOCTURNAL) && !is_affected_by(ch, AFF_NOSHOW))
				SET_BIT(ch->affected_by, AFF_NOSHOW);
		}
		else if (is_npc(ch) && sun >= SolarPosition::Sunset && ch->in_room && number_percent() < 90 && ch->fighting == nullptr)
		{
			if (IS_SET(ch->act, ACT_NOCTURNAL) && is_affected_by(ch, AFF_NOSHOW))
				REMOVE_BIT(ch->affected_by, AFF_NOSHOW);
			else if (IS_SET(ch->act, ACT_DIURNAL) && !is_affected_by(ch, AFF_NOSHOW))
				SET_BIT(ch->affected_by, AFF_NOSHOW);
		}

		if (ch->pause > 0)
			ch->pause--;

		if (is_npc(ch) && ch->hit < 0 && ch->in_room)
		{
			RS.Logger.Warn("{} in {} has HP {}", ch->name, ch->in_room->vnum, ch->hit);
		}

		if (ch->ghost > 0)
		{
			ch->ghost--;

			switch (ch->ghost)
			{
				case 4:
					send_to_char("Your body starts to collect itself.\n\r", ch);
					break;
				case 2:
					send_to_char("Your body begins to solidify.\n\r", ch);
					break;
				case 0:
					send_to_char("You are no longer a ghost.\n\r", ch);
					break;
			}
		}

		if (ch->bounty_timer > 0)
			ch->bounty_timer--;

		if (ch->ghost > 0)
			ghost = true;

		/* LOWBIE LEVELLING */
		if (!is_npc(ch) && ch->level < 20 && (ch->in_room->vnum > 24599 || ch->in_room->vnum < 24500))
		{
			char buf1[MSL];
			while (ch->level < 20)
			{
				ch->level++;
				advance_level(ch, true);
			}

			ch->exp = exp_per_level(ch) * (ch->level - 1);

			colorconv(buf1, "{RYou feel more experienced as you depart the Adventurer's Academy!{x\n\r", ch);
			send_to_char(buf1, ch);

			colorconv(buf1, "{GYou are now level 20.{x\n\r", ch);
			send_to_char(buf1, ch);

			if (ch->pet)
			{
				sprintf(buf1, "Remember, you can ask your familiar questions.  For example, 'say %s, how do I get to my guild?'.\n\r", ch->pet->short_descr);
				send_to_char(buf1, ch);
			}
		}

		if (!is_npc(ch))
			ch->Profs()->UpdateProfPoints();

		if (!is_affected_by(ch, AFF_SLEEP) && is_affected(ch, gsn_bleeding) && ch->position == POS_SLEEPING)
			ch->position = POS_STANDING;

		if (ch->position >= POS_STUNNED)
		{
			if (ch->hit < ch->max_hit) /* Some regen stuff */
			{
				hgain = hit_gain(ch);
				ch->hit += hgain;
			}
			else
			{
				ch->hit = ch->max_hit;
			}

			if (ch->mana < ch->max_mana)
				ch->mana += mana_gain(ch);
			else
				ch->mana = ch->max_mana;

			if (ch->move < ch->max_move)
				ch->move += (is_affected(ch, gsn_repose)) ? (move_gain(ch) * 2) : (move_gain(ch));
			else
				ch->move = ch->max_move;
		}

		if (ch->position == POS_STUNNED)
			update_pos(ch);

		if (ch->position < POS_STUNNED)
			damage_new(ch, ch, 2, gsn_bleeding, DAM_TRUESTRIKE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "slow bleeding");

		ch->talismanic = std::max((double)0, ch->talismanic - 0.0625);

		if (!is_npc(ch) && ch->in_room)
		{
			ch->pcdata->sect_time[0]++;
			ch->pcdata->sect_time[ch->in_room->sector_type]++;
		}

		if (!is_npc(ch) && ch->pcdata->save_timer)
			ch->pcdata->save_timer--;

		if (!is_npc(ch) /* && !is_immortal(ch) */)
		{
			OBJ_DATA *obj;

			if ((obj = get_eq_char(ch, WEAR_LIGHT)) != nullptr && obj->item_type == ITEM_LIGHT && obj->value[2] > 0)
			{
				if (--obj->value[2] == 0 && ch->in_room != nullptr)
				{
					ch->in_room->light = std::max(0, ch->in_room->light - 3);
					act("$p goes out.", ch, obj, nullptr, TO_ROOM);
					act("$p flickers and goes out.", ch, obj, nullptr, TO_CHAR);
					extract_obj(obj);
				}
				else if (obj->value[2] <= 5 && ch->in_room != nullptr)
				{
					act("$p flickers.", ch, obj, nullptr, TO_CHAR);
				}
			}

			ch->timer++;

			if (ch->timer >= 25 && !is_heroimm(ch) && !is_immortal(ch) && !IS_SET(ch->act, PLR_NOVOID))
			{
				if (ch->was_in_room == nullptr && ch->in_room != nullptr)
				{
					ch->was_in_room = ch->in_room;

					if (ch->fighting != nullptr)
						stop_fighting(ch, true);

					act("$n disappears into the void.", ch, nullptr, nullptr, TO_ROOM);
					send_to_char("You disappear into the void.\n\r", ch);

					if (ch->level > 1)
						save_char_obj(ch);

					ch->pause = 0;
					do_quit_new(ch, "", true);
					continue;
				}
			}

			gain_condition(ch, COND_DRUNK, -1);
			gain_condition(ch, COND_THIRST, 1);
			gain_condition(ch, COND_HUNGER, 1);
		}

		if (!is_npc(ch) && ch->desc == nullptr)
		{
			/* nothing */
		}
		else
		{
			for (paf = ch->affected; paf != nullptr; paf = paf_next)
			{
				paf_next = paf->next;
				charm_gone= false;

				if (!ghost && ch->ghost > 0)
					break;

				if (paf->duration > 0)
				{
					if (paf->tick_fun)
						(*paf->tick_fun)(ch, paf);

					if (!ch || (!ghost && ch->ghost > 0))
						break;

					if (!paf)
						continue;

					paf->duration--;

					if (number_range(0, 4) == 0 && paf->level > 0)
						paf->level--; /* spell strength fades with time */
				}
				else if (paf->duration < 0)
				{
					if (paf->tick_fun)
						(*paf->tick_fun)(ch, paf);

					if (!ghost && ch->ghost > 0)
						break;
				}
				else if (paf->type == gsn_entwine
					&& (paf->owner == nullptr || (paf->owner && ch->in_room != paf->owner->in_room)))
				{
					affect_remove(ch, paf);
				}
				else
				{
					if (((paf->owner && paf->owner->Class()->GetIndex() == CLASS_PALADIN)
							|| (!paf->owner && ch->Class()->GetIndex() == CLASS_PALADIN)
							&& trusts(ch, paf->owner ? paf->owner : ch))
						&& paf->aftype == AFT_COMMUNE)
					{
						if (number_percent() < (get_skill(paf->owner ? paf->owner : ch, gsn_channeling) * .85)
							&& !(skill_table[paf->type].dispel & CAN_CLEANSE))
						{
							check_improve(paf->owner ? paf->owner : ch, gsn_channeling, true, 1);

							if (!paf->owner || ch == paf->owner)
							{
								act("You feel invigorated as your $t supplication is renewed by your deity.", ch, skill_table[paf->type].name, 0, TO_CHAR);
							}
							else
							{
								act("You feel invigorated as $N renews your $t supplication.", ch, skill_table[paf->type].name, paf->owner, TO_CHAR);
							}

							paf->duration = paf->init_duration;
							ch->mana = std::max(ch->mana - skill_table[paf->type].min_mana, 0);
							continue;
						}
					}

					if (paf_next == nullptr || paf_next->type != paf->type || paf_next->duration > 0)
					{
						if (paf->type > 0 && str_cmp(skill_table[paf->type].msg_off, ""))
						{
							send_to_char(skill_table[paf->type].msg_off, ch);
							send_to_char("\n\r", ch);
						}

						if (paf->type && str_cmp(skill_table[paf->type].room_msg_off, "") && is_awake(ch))
							act(skill_table[paf->type].room_msg_off, ch, 0, 0, TO_ROOM);
					}
					affect_remove(ch, paf);
				}
			}
		}

		if (!ch)
			continue;

		if (!ghost && ch->ghost > 0)
			continue;

		/*
		 * Careful with the damages here,
		 *   MUST NOT refer to ch after damage taken,
		 *   as it may be lethal damage (on NPC).
		 *
		 *   You must add a line to the poison check in damage_new in fight.c!
		 */

		if (!is_npc(ch) && ch->in_room && ch->in_room->sector_type == SECT_BURNING)
			damage_new(ch, ch, dice(ch->level / 2, 2), gsn_bleeding, DAM_FIRE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the searing heat*");
	}
	/*
	 * Autosave and autoquit.
	 * Check that these chars still exist.
	 */
	for (ch = char_list; ch != nullptr; ch = ch_next)
	{
		ch_next = ch->next;

		if (ch->desc != nullptr && ch->desc->descriptor % 3 == save_number)
			save_char_obj(ch);
	}
}